

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Miter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char **__filename;
  bool bVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *pGVar4;
  FILE *__stream;
  Gia_Man_t *pNew;
  char *pcVar5;
  uint local_74;
  int fVerbose;
  int fTrans;
  int fSeq;
  int fDualOut;
  int nInsDup;
  int c;
  int nArgcNew;
  char **pArgvNew;
  char *pTemp;
  char *FileName;
  Gia_Man_t *pSecond;
  Gia_Man_t *pAux;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fSeq = 0;
  fTrans = 0;
  fVerbose = 0;
  bVar1 = false;
  local_74 = 0;
  Extra_UtilGetoptReset();
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"Idstvh");
    if (iVar2 == -1) {
      if (!bVar1) {
        if (argc - globalUtilOptind != 1) {
          Abc_Print(-1,"File name is not given on the command line.\n");
          return 1;
        }
        __filename = (char **)argv[globalUtilOptind];
        for (pArgvNew = __filename; *(char *)pArgvNew != '\0';
            pArgvNew = (char **)((long)pArgvNew + 1)) {
          if (*(char *)pArgvNew == '>') {
            *(undefined1 *)pArgvNew = 0x5c;
          }
        }
        __stream = fopen((char *)__filename,"r");
        if (__stream == (FILE *)0x0) {
          Abc_Print(-1,"Cannot open input file \"%s\". ",__filename);
          pcVar5 = Extra_FileGetSimilarName
                             ((char *)__filename,".aig",(char *)0x0,(char *)0x0,(char *)0x0,
                              (char *)0x0);
          if (pcVar5 != (char *)0x0) {
            Abc_Print(1,"Did you mean \"%s\"?",pcVar5);
          }
          Abc_Print(1,"\n");
          return 1;
        }
        fclose(__stream);
        pGVar4 = Gia_AigerRead((char *)__filename,0,0);
        if (pGVar4 == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Reading AIGER has failed.\n");
          return 0;
        }
        pNew = Gia_ManMiter(pAbc->pGia,pGVar4,fSeq,fTrans,fVerbose,0,local_74);
        Gia_ManStop(pGVar4);
        Abc_FrameUpdateGia(pAbc,pNew);
        return 0;
      }
      uVar3 = Gia_ManPoNum(pAbc->pGia);
      if ((uVar3 & 1) == 1) {
        Abc_Print(-1,"Abc_CommandAbc9Miter(): The number of outputs should be even.\n");
        return 0;
      }
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Miter(): There is no AIG.\n");
        return 1;
      }
      pGVar4 = Gia_ManTransformMiter(pAbc->pGia);
      Abc_FrameUpdateGia(pAbc,pGVar4);
      Abc_Print(1,"The miter (current AIG) is transformed by XORing POs pair-wise.\n");
      return 0;
    }
    switch(iVar2) {
    case 0x49:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by a char string.\n");
        goto LAB_0024f91b;
      }
      fSeq = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (fSeq < 0) {
LAB_0024f91b:
        Abc_Print(-2,"usage: &miter [-I num] [-dstvh] <file>\n");
        Abc_Print(-2,"\t         creates miter of two designs (current AIG vs. <file>)\n");
        Abc_Print(-2,"\t-I num : the number of last PIs to replicate [default = %d]\n",
                  (ulong)(uint)fSeq);
        pcVar5 = "no";
        if (fTrans != 0) {
          pcVar5 = "yes";
        }
        Abc_Print(-2,"\t-d     : toggle creating dual-output miter [default = %s]\n",pcVar5);
        pcVar5 = "no";
        if (fVerbose != 0) {
          pcVar5 = "yes";
        }
        Abc_Print(-2,"\t-s     : toggle creating sequential miter [default = %s]\n",pcVar5);
        pcVar5 = "no";
        if (bVar1) {
          pcVar5 = "yes";
        }
        Abc_Print(-2,"\t-t     : toggle XORing pair-wise POs of the miter [default = %s]\n",pcVar5);
        pcVar5 = "no";
        if (local_74 != 0) {
          pcVar5 = "yes";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        Abc_Print(-2,"\t<file> : AIGER file with the design to miter\n");
        return 1;
      }
      break;
    default:
      goto LAB_0024f91b;
    case 100:
      fTrans = fTrans ^ 1;
      break;
    case 0x68:
      goto LAB_0024f91b;
    case 0x73:
      fVerbose = fVerbose ^ 1;
      break;
    case 0x74:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x76:
      local_74 = local_74 ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Miter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Gia_Man_t * pAux;
    Gia_Man_t * pSecond;
    char * FileName, * pTemp;
    char ** pArgvNew;
    int nArgcNew;
    int c;
    int nInsDup  = 0;
    int fDualOut = 0;
    int fSeq     = 0;
    int fTrans   = 0;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Idstvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by a char string.\n" );
                goto usage;
            }
            nInsDup = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nInsDup < 0 )
                goto usage;
            break;
        case 'd':
            fDualOut ^= 1;
            break;
        case 's':
            fSeq ^= 1;
            break;
        case 't':
            fTrans ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fTrans )
    {
        if ( (Gia_ManPoNum(pAbc->pGia) & 1) == 1 )
        {
            Abc_Print( -1, "Abc_CommandAbc9Miter(): The number of outputs should be even.\n" );
            return 0;
        }
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Miter(): There is no AIG.\n" );
            return 1;
        }
        pAux = Gia_ManTransformMiter( pAbc->pGia );
        Abc_FrameUpdateGia( pAbc, pAux );
        Abc_Print( 1, "The miter (current AIG) is transformed by XORing POs pair-wise.\n" );
        return 0;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }

    // get the input file name
    FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    pSecond = Gia_AigerRead( FileName, 0, 0 );
    if ( pSecond == NULL )
    {
        Abc_Print( -1, "Reading AIGER has failed.\n" );
        return 0;
    }
    // compute the miter
    pAux = Gia_ManMiter( pAbc->pGia, pSecond, nInsDup, fDualOut, fSeq, 0, fVerbose );
    Gia_ManStop( pSecond );
    Abc_FrameUpdateGia( pAbc, pAux );
    return 0;

usage:
    Abc_Print( -2, "usage: &miter [-I num] [-dstvh] <file>\n" );
    Abc_Print( -2, "\t         creates miter of two designs (current AIG vs. <file>)\n" );
    Abc_Print( -2, "\t-I num : the number of last PIs to replicate [default = %d]\n", nInsDup );
    Abc_Print( -2, "\t-d     : toggle creating dual-output miter [default = %s]\n", fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle creating sequential miter [default = %s]\n", fSeq? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle XORing pair-wise POs of the miter [default = %s]\n", fTrans? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : AIGER file with the design to miter\n");
    return 1;
}